

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O3

bool __thiscall HttpContext::processRequestLine(HttpContext *this,char *begin,char *end)

{
  bool bVar1;
  Version VVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  string *psVar7;
  
  pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(begin,end);
  if ((pcVar3 != end) && (bVar1 = HttpRequest::SetMethod(&this->_request,begin,pcVar3), bVar1)) {
    pcVar3 = pcVar3 + 1;
    pcVar4 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(pcVar3,end);
    if (pcVar4 != end) {
      pcVar5 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(pcVar3);
      psVar7 = &(this->_request)._path;
      pcVar6 = (char *)(this->_request)._path._M_string_length;
      if (pcVar5 != pcVar4) {
        std::__cxx11::string::replace((ulong)psVar7,0,pcVar6,(ulong)pcVar3);
        psVar7 = &(this->_request)._query;
        pcVar6 = (char *)(this->_request)._query._M_string_length;
        pcVar3 = pcVar5;
      }
      std::__cxx11::string::replace((ulong)psVar7,0,pcVar6,(ulong)pcVar3);
      if (*(long *)(pcVar4 + 1) == 0x312e312f50545448) {
        VVar2 = Http11;
      }
      else {
        if (*(long *)(pcVar4 + 1) != 0x302e312f50545448) {
          return false;
        }
        VVar2 = Http10;
      }
      (this->_request)._version = VVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool HttpContext::processRequestLine(const char* begin, const char* end) {
    bool succeed = false;
    const char* start = begin;
    const char* space = std::find(start, end, ' ');
    if (space != end && _request.SetMethod(start, space)) {
        start = space + 1;
        space = std::find(start, end, ' ');
        if (space != end) {
            const char* question = std::find(start, space, '?');
            if (question != space) {
                _request.SetPath(start, question);
                _request.SetQuery(question, space);

            } else {
                _request.SetPath(start, space);
            }

            start = space + 1;
            const char* version_end = start + VERSION_LEN - 1;
            succeed = true;
            if (std::equal(start, version_end, "HTTP/1.1")) {
                _request.SetVersion(Http11);

            } else if (std::equal(start, version_end, "HTTP/1.0")) {
                _request.SetVersion(Http10);

            } else {
                succeed = false;
            }
        }
    }
    return succeed;
}